

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2pointutil.cc
# Opt level: O2

bool S2::ApproxEquals(S2Point *a,S2Point *b,S1Angle max_error)

{
  bool bVar1;
  S1Angle local_50;
  S2LogMessage local_48;
  D local_38;
  
  local_38.c_[0] = 0.0;
  local_38.c_[1] = 0.0;
  local_38.c_[2] = 0.0;
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                    ((BasicVector<Vector3,_double,_3UL> *)a,&local_38);
  if (bVar1) {
    local_38.c_[0] = 0.0;
    local_38.c_[1] = 0.0;
    local_38.c_[2] = 0.0;
    bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                      ((BasicVector<Vector3,_double,_3UL> *)b,&local_38);
    if (bVar1) {
      S1Angle::S1Angle(&local_50,a,b);
      return local_50.radians_ <= max_error.radians_;
    }
    S2LogMessage::S2LogMessage
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2pointutil.cc"
               ,0x27,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_48.stream_,"Check failed: (b) != (S2Point()) ");
  }
  else {
    S2LogMessage::S2LogMessage
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2pointutil.cc"
               ,0x26,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_48.stream_,"Check failed: (a) != (S2Point()) ");
  }
  abort();
}

Assistant:

bool ApproxEquals(const S2Point& a, const S2Point& b, S1Angle max_error) {
  S2_DCHECK_NE(a, S2Point());
  S2_DCHECK_NE(b, S2Point());
  return S1Angle(a, b) <= max_error;
}